

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O2

obj_property * brand_property(wchar_t brand_idx)

{
  ushort uVar1;
  brand_conflict *pbVar2;
  obj_property *poVar3;
  char *pcVar4;
  obj_property *poVar5;
  ulong uVar6;
  
  uVar1 = z_info->property_max;
  pbVar2 = brands + brand_idx;
  uVar6 = 0;
  poVar5 = obj_properties;
  do {
    uVar6 = uVar6 + 1;
    if (uVar1 <= uVar6) {
      return (obj_property *)0x0;
    }
    poVar3 = poVar5 + 1;
    poVar5 = poVar5 + 1;
    pcVar4 = strstr(poVar3->name,pbVar2->name);
  } while (pcVar4 == (char *)0x0);
  return poVar5;
}

Assistant:

struct obj_property *brand_property(int brand_idx)
{
	int i;

	for (i = 1; i < z_info->property_max; i++) {
		struct obj_property *prop =	&obj_properties[i];
		char *s = strstr(prop->name, brands[brand_idx].name);
		if (s) return prop;
	}
	return NULL;
}